

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

int lws_sa46_on_net(lws_sockaddr46 *sa46a,lws_sockaddr46 *sa46_net,int net_len)

{
  bool bVar1;
  int iVar2;
  in_addr *piVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint8_t norm [16];
  
  iVar2 = 1;
  if ((sa46a->sa4).sin_family == 2) {
    if ((sa46_net->sa4).sin_family == 10) {
      piVar3 = (in_addr *)norm;
      norm[0xc] = (uint8_t)(sa46a->sa4).sin_addr.s_addr;
      norm[0xd] = *(uint8_t *)((long)&(sa46a->sa4).sin_addr.s_addr + 1);
      norm[0xe] = *(uint8_t *)((long)&(sa46a->sa4).sin_addr.s_addr + 2);
      norm[0xf] = *(uint8_t *)((long)&(sa46a->sa4).sin_addr.s_addr + 3);
      norm[0] = '\0';
      norm[1] = '\0';
      norm[2] = '\0';
      norm[3] = '\0';
      norm[4] = '\0';
      norm[5] = '\0';
      norm[6] = '\0';
      norm[7] = '\0';
      norm[8] = '\0';
      norm[9] = '\0';
      norm[10] = 0xff;
      norm[0xb] = 0xff;
    }
    else {
      piVar3 = &(sa46a->sa4).sin_addr;
    }
    if ((sa46_net->sa4).sin_family == 2) {
      if (0 < net_len) {
        iVar2 = -net_len;
        uVar5 = 0xff;
        lVar4 = 0;
        do {
          iVar2 = iVar2 + 8;
          uVar6 = uVar5 & 0xff;
          uVar5 = uVar6 << ((byte)iVar2 & 0x1f);
          if (7 < net_len) {
            uVar5 = uVar6;
          }
          if ((byte)((*(byte *)((long)sa46_net + lVar4 + 4) ^
                     *(byte *)((long)&piVar3->s_addr + lVar4)) & (byte)uVar5) != 0) {
            return 1;
          }
          lVar4 = lVar4 + 1;
          bVar1 = 8 < net_len;
          net_len = net_len + -8;
        } while (bVar1);
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
lws_sa46_on_net(const lws_sockaddr46 *sa46a, const lws_sockaddr46 *sa46_net,
		int net_len)
{
	uint8_t mask = 0xff, norm[16];
	const uint8_t *p1, *p2;

	if (sa46a->sa4.sin_family == AF_INET) {
		p1 = (uint8_t *)&sa46a->sa4.sin_addr;
		if (sa46_net->sa4.sin_family == AF_INET6) {
			/* ip is v4, net is v6, promote ip to v6 */

			lws_4to6(norm, p1);
			p1 = norm;
		}
#if defined(LWS_WITH_IPV6)
	} else
		if (sa46a->sa4.sin_family == AF_INET6) {
			p1 = (uint8_t *)&sa46a->sa6.sin6_addr;
#endif
		} else
			return 1;

	if (sa46_net->sa4.sin_family == AF_INET) {
		p2 = (uint8_t *)&sa46_net->sa4.sin_addr;
		if (sa46a->sa4.sin_family == AF_INET6) {
			/* ip is v6, net is v4, promote net to v6 */

			lws_4to6(norm, p2);
			p2 = norm;
			/* because the mask length is for net v4 address */
			net_len += 12 * 8;
		}
#if defined(LWS_WITH_IPV6)
	} else
		if (sa46a->sa4.sin_family == AF_INET6) {
			p2 = (uint8_t *)&sa46_net->sa6.sin6_addr;
#endif
		} else
			return 1;

	while (net_len > 0) {
		if (net_len < 8)
			mask = (uint8_t)(mask << (8 - net_len));

		if (((*p1++) & mask) != ((*p2++) & mask))
			return 1;

		net_len -= 8;
	}

	return 0;
}